

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_rdhwr(DisasContext_conflict6 *ctx,int rt,int rd,int sel)

{
  TCGContext_conflict6 *tcg_ctx_00;
  uint32_t uVar1;
  TCGv_i64 ret;
  TCGv_i64 t0;
  TCGContext_conflict6 *tcg_ctx;
  int sel_local;
  int rd_local;
  int rt_local;
  DisasContext_conflict6 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  check_insn(ctx,0x40);
  ret = tcg_temp_new_i64(tcg_ctx_00);
  switch(rd) {
  case 0:
    gen_helper_rdhwr_cpunum(tcg_ctx_00,ret,tcg_ctx_00->cpu_env);
    gen_store_gpr(tcg_ctx_00,ret,rt);
    break;
  case 1:
    gen_helper_rdhwr_synci_step(tcg_ctx_00,ret,tcg_ctx_00->cpu_env);
    gen_store_gpr(tcg_ctx_00,ret,rt);
    break;
  case 2:
    uVar1 = tb_cflags((ctx->base).tb);
    if ((uVar1 & 0x20000) != 0) {
      gen_io_start(tcg_ctx_00);
    }
    gen_helper_rdhwr_cc(tcg_ctx_00,ret,tcg_ctx_00->cpu_env);
    gen_store_gpr(tcg_ctx_00,ret,rt);
    gen_save_pc(tcg_ctx_00,(ctx->base).pc_next + 4);
    (ctx->base).is_jmp = DISAS_TARGET_1;
    break;
  case 3:
    gen_helper_rdhwr_ccres(tcg_ctx_00,ret,tcg_ctx_00->cpu_env);
    gen_store_gpr(tcg_ctx_00,ret,rt);
    break;
  case 4:
    check_insn(ctx,0x2000);
    if (sel != 0) {
      generate_exception(ctx,0x14);
    }
    gen_helper_rdhwr_performance(tcg_ctx_00,ret,tcg_ctx_00->cpu_env);
    gen_store_gpr(tcg_ctx_00,ret,rt);
    break;
  case 5:
    check_insn(ctx,0x2000);
    gen_helper_rdhwr_xnp(tcg_ctx_00,ret,tcg_ctx_00->cpu_env);
    gen_store_gpr(tcg_ctx_00,ret,rt);
    break;
  default:
    generate_exception_end(ctx,0x14);
    break;
  case 0x1d:
    if (((ctx->hflags & 0x10) == 0) && ((ctx->hflags & 0x200000) == 0)) {
      generate_exception_end(ctx,0x14);
    }
    else {
      tcg_gen_ld_i64_mips64el(tcg_ctx_00,ret,tcg_ctx_00->cpu_env,0x1a0);
      gen_store_gpr(tcg_ctx_00,ret,rt);
    }
  }
  tcg_temp_free_i64(tcg_ctx_00,ret);
  return;
}

Assistant:

static void gen_rdhwr(DisasContext *ctx, int rt, int rd, int sel)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;

    /*
     * The Linux kernel will emulate rdhwr if it's not supported natively.
     * Therefore only check the ISA in system mode.
     */
    check_insn(ctx, ISA_MIPS32R2);
    t0 = tcg_temp_new(tcg_ctx);

    switch (rd) {
    case 0:
        gen_helper_rdhwr_cpunum(tcg_ctx, t0, tcg_ctx->cpu_env);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case 1:
        gen_helper_rdhwr_synci_step(tcg_ctx, t0, tcg_ctx->cpu_env);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case 2:
        if (tb_cflags(ctx->base.tb) & CF_USE_ICOUNT) {
            gen_io_start(tcg_ctx);
        }
        gen_helper_rdhwr_cc(tcg_ctx, t0, tcg_ctx->cpu_env);
        gen_store_gpr(tcg_ctx, t0, rt);
        /*
         * Break the TB to be able to take timer interrupts immediately
         * after reading count. DISAS_STOP isn't sufficient, we need to ensure
         * we break completely out of translated code.
         */
        gen_save_pc(tcg_ctx, ctx->base.pc_next + 4);
        ctx->base.is_jmp = DISAS_EXIT;
        break;
    case 3:
        gen_helper_rdhwr_ccres(tcg_ctx, t0, tcg_ctx->cpu_env);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case 4:
        check_insn(ctx, ISA_MIPS32R6);
        if (sel != 0) {
            /*
             * Performance counter registers are not implemented other than
             * control register 0.
             */
            generate_exception(ctx, EXCP_RI);
        }
        gen_helper_rdhwr_performance(tcg_ctx, t0, tcg_ctx->cpu_env);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case 5:
        check_insn(ctx, ISA_MIPS32R6);
        gen_helper_rdhwr_xnp(tcg_ctx, t0, tcg_ctx->cpu_env);
        gen_store_gpr(tcg_ctx, t0, rt);
        break;
    case 29:
        if ((ctx->hflags & MIPS_HFLAG_CP0) ||
            (ctx->hflags & MIPS_HFLAG_HWRENA_ULR)) {
            tcg_gen_ld_tl(tcg_ctx, t0, tcg_ctx->cpu_env,
                          offsetof(CPUMIPSState, active_tc.CP0_UserLocal));
            gen_store_gpr(tcg_ctx, t0, rt);
        } else {
            generate_exception_end(ctx, EXCP_RI);
        }
        break;
    default:            /* Invalid */
        MIPS_INVAL("rdhwr");
        generate_exception_end(ctx, EXCP_RI);
        break;
    }
    tcg_temp_free(tcg_ctx, t0);
}